

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

bool __thiscall
QPDF::pipeStreamData
          (QPDF *this,QPDFObjGen og,qpdf_offset_t offset,size_t length,QPDFObjectHandle *stream_dict
          ,bool is_root_metadata,Pipeline *pipeline,bool suppress_warnings,bool will_retry)

{
  QPDFObjectHandle stream_dict_00;
  bool bVar1;
  undefined7 in_register_00000089;
  undefined1 will_retry_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  stream_dict_00.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._1_7_ = in_register_00000089;
  stream_dict_00.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ = is_root_metadata;
  std::__shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             &(((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
              super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
  will_retry_00 = 0x42;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)stream_dict);
  stream_dict_00.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&local_60;
  bVar1 = pipeStreamData((shared_ptr<QPDF::EncryptionParameters> *)&local_50,
                         (shared_ptr<InputSource> *)&local_40,this,og,offset,length,stream_dict_00,
                         SUB81(pipeline,0),(Pipeline *)(ulong)suppress_warnings,will_retry,
                         (bool)will_retry_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return bVar1;
}

Assistant:

bool
QPDF::pipeStreamData(
    QPDFObjGen og,
    qpdf_offset_t offset,
    size_t length,
    QPDFObjectHandle stream_dict,
    bool is_root_metadata,
    Pipeline* pipeline,
    bool suppress_warnings,
    bool will_retry)
{
    return pipeStreamData(
        m->encp,
        m->file,
        *this,
        og,
        offset,
        length,
        stream_dict,
        is_root_metadata,
        pipeline,
        suppress_warnings,
        will_retry);
}